

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_ep_dial_cb(void *arg)

{
  nni_aio *aio;
  nng_err result;
  ipc_pipe *in_RAX;
  nng_stream *conn;
  ipc_pipe *local_28;
  ipc_pipe *p;
  
  local_28 = in_RAX;
  nni_mtx_lock((nni_mtx *)arg);
  result = nni_aio_result((nni_aio *)((long)arg + 0x60));
  if (result == NNG_OK) {
    conn = (nng_stream *)nni_aio_get_output((nni_aio *)((long)arg + 0x60),0);
    if (*(char *)((long)arg + 0x33) == '\x01') {
      nng_stream_free(conn);
      result = NNG_ECLOSED;
    }
    else {
      result = nni_pipe_alloc_dialer(&local_28,*(nni_dialer **)((long)arg + 0x50));
      if (result == NNG_OK) {
        ipc_pipe_start(local_28,conn,(ipc_ep *)arg);
        goto LAB_0012ce42;
      }
      nng_stream_free(conn);
    }
  }
  aio = *(nni_aio **)((long)arg + 0x58);
  if (aio != (nni_aio *)0x0) {
    *(undefined8 *)((long)arg + 0x58) = 0;
    nni_aio_finish_error(aio,result);
  }
LAB_0012ce42:
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
ipc_ep_dial_cb(void *arg)
{
	ipc_ep     *ep  = arg;
	nni_aio    *aio = &ep->conn_aio;
	nni_aio    *uaio;
	ipc_pipe   *p;
	int         rv;
	nng_stream *conn;

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);

	if (ep->closed) {
		nng_stream_free(conn);
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_pipe_alloc_dialer((void **) &p, ep->ndialer)) != 0) {
		nng_stream_free(conn);
		goto error;
	}

	ipc_pipe_start(p, conn, ep);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// Error connecting.  We need to pass this straight back
	// to the user.
	if ((uaio = ep->user_aio) != NULL) {
		ep->user_aio = NULL;
		nni_aio_finish_error(uaio, rv);
	}
	nni_mtx_unlock(&ep->mtx);
}